

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpBoolXor::TypeOpBoolXor(TypeOpBoolXor *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpBoolXor *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"^^",&local_39);
  TypeOpBinary::TypeOpBinary
            (&this->super_TypeOpBinary,t,CPUI_BOOL_XOR,(string *)local_38,TYPE_BOOL,TYPE_BOOL);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084c7d0;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x14080;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehaviorBoolXor::OpBehaviorBoolXor((OpBehaviorBoolXor *)this_00);
  (this->super_TypeOpBinary).super_TypeOp.behave = this_00;
  return;
}

Assistant:

TypeOpBoolXor::TypeOpBoolXor(TypeFactory *t)
  : TypeOpBinary(t,CPUI_BOOL_XOR,"^^",TYPE_BOOL,TYPE_BOOL)
{
  opflags = PcodeOp::binary | PcodeOp::commutative | PcodeOp::booloutput;
  behave = new OpBehaviorBoolXor();
}